

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

void __thiscall
CLI::App::_parse_subcommand
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer *pppAVar1;
  pointer puVar2;
  App *this_00;
  pointer pbVar3;
  pointer pcVar4;
  iterator __position;
  bool bVar5;
  size_t sVar6;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> _Var7;
  HorribleError *this_01;
  long *plVar8;
  size_type *psVar9;
  pointer puVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  sVar6 = _count_remaining_positionals(this,true);
  if (sVar6 != 0) {
    _parse_positional(this,args);
    return;
  }
  puVar10 = (this->subcommands_).
            super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar11 = puVar10 == puVar2;
  if (!bVar11) {
    do {
      this_00 = (puVar10->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t
                .super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pcVar4 = pbVar3[-1]._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,pcVar4 + pbVar3[-1]._M_string_length);
      bVar5 = check_name(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (bVar5) {
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &pbVar3[-1].field_2) {
          operator_delete(pcVar4);
        }
        local_90._M_dataplus._M_p =
             (pointer)(puVar10->_M_t).
                      super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                      super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                      super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
        _Var7 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<CLI::App**,std::vector<CLI::App*,std::allocator<CLI::App*>>>,__gnu_cxx::__ops::_Iter_equals_val<CLI::App*const>>
                          ((this->parsed_subcommands_).
                           super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->parsed_subcommands_).
                           super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_90);
        __position._M_current =
             (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (_Var7._M_current == __position._M_current) {
          local_90._M_dataplus._M_p =
               (pointer)(puVar10->_M_t).
                        super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                        super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                        super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
          if (__position._M_current ==
              (this->parsed_subcommands_).
              super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*>
                      ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this->parsed_subcommands_,
                       __position,(App **)&local_90);
          }
          else {
            *__position._M_current = (App *)local_90._M_dataplus._M_p;
            pppAVar1 = &(this->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppAVar1 = *pppAVar1 + 1;
          }
        }
        _parse((puVar10->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl,args);
        if (bVar5) {
          if (!bVar11) {
            return;
          }
          break;
        }
      }
      puVar10 = puVar10 + 1;
      bVar11 = puVar10 == puVar2;
    } while (!bVar11);
  }
  if (this->parent_ != (App *)0x0) {
    _parse_subcommand(this->parent_,args);
    return;
  }
  this_01 = (HorribleError *)__cxa_allocate_exception(0x38);
  ::std::operator+(&local_90,"Subcommand ",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + -1);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_90);
  local_70._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar9) {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70.field_2._8_8_ = plVar8[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar9;
  }
  local_70._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  HorribleError::HorribleError(this_01,&local_70);
  __cxa_throw(this_01,&HorribleError::typeinfo,Error::~Error);
}

Assistant:

void _parse_subcommand(std::vector<std::string> &args) {
        if(_count_remaining_positionals(/* required */ true) > 0)
            return _parse_positional(args);
        for(const App_p &com : subcommands_) {
            if(com->check_name(args.back())) {
                args.pop_back();
                if(std::find(std::begin(parsed_subcommands_), std::end(parsed_subcommands_), com.get()) ==
                   std::end(parsed_subcommands_))
                    parsed_subcommands_.push_back(com.get());
                com->_parse(args);
                return;
            }
        }
        if(parent_ != nullptr)
            return parent_->_parse_subcommand(args);
        else
            throw HorribleError("Subcommand " + args.back() + " missing");
    }